

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzgeoelrefpattern.h.h
# Opt level: O2

TPZGeoEl * __thiscall
TPZGeoElRefPattern<pzgeom::TPZArc3D>::Clone
          (TPZGeoElRefPattern<pzgeom::TPZArc3D> *this,TPZGeoMesh *DestMesh)

{
  TPZGeoMesh *pTVar1;
  TPZGeoElRefPattern<pzgeom::TPZArc3D> *this_00;
  
  pTVar1 = (this->super_TPZGeoElRefLess<pzgeom::TPZArc3D>).super_TPZGeoEl.fMesh;
  this_00 = (TPZGeoElRefPattern<pzgeom::TPZArc3D> *)operator_new(800);
  if (pTVar1 == DestMesh) {
    TPZGeoElRefPattern(this_00,this);
  }
  else {
    TPZGeoElRefPattern(this_00,DestMesh,this);
  }
  return (TPZGeoEl *)this_00;
}

Assistant:

TPZGeoEl * TPZGeoElRefPattern<TGeo>::Clone(TPZGeoMesh &DestMesh) const{
    if(&DestMesh == this->Mesh())
    {
        return new TPZGeoElRefPattern<TGeo>(*this);
    }
    else
    {
        return new TPZGeoElRefPattern<TGeo>(DestMesh, *this);
    }
}